

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall GlobOpt::TrackInstrsForScopeObjectRemoval(GlobOpt *this,Instr *instr)

{
  undefined4 uVar1;
  Opnd *pOVar2;
  Opnd *this_00;
  Func *pFVar3;
  Func *func;
  code *pcVar4;
  OpndKind OVar5;
  bool bVar6;
  ArgSlot AVar7;
  ushort uVar8;
  int iVar9;
  undefined4 *puVar10;
  JITTimeFunctionBody *pJVar11;
  StackSym *pSVar12;
  undefined4 extraout_var;
  AddrOpnd *src1Opnd;
  RegOpnd *pRVar13;
  Instr *pIVar14;
  ushort uVar15;
  short sVar16;
  ushort uVar17;
  StackSym *local_68;
  Instr *local_38;
  
  pOVar2 = instr->m_dst;
  if (instr->m_opcode == Ld_A) {
    this_00 = instr->m_src1;
    OVar5 = IR::Opnd::GetKind(this_00);
    if (((OVar5 == OpndKindReg) && (bVar6 = Func::IsStackArgsEnabled(instr->m_func), bVar6)) &&
       (bVar6 = IR::Opnd::IsScopeObjOpnd(this_00,instr->m_func), bVar6)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x57f,
                         "(!instr->m_func->IsStackArgsEnabled() || !src1->IsScopeObjOpnd(instr->m_func))"
                         ,"There can be no aliasing for scope object.");
      if (!bVar6) goto LAB_004488a4;
      *puVar10 = 0;
    }
  }
  bVar6 = Func::IsStackArgsEnabled(instr->m_func);
  if ((bVar6) && (this->prePassLoop == (Loop *)0x0)) {
    if (instr->m_opcode != InlineeStart) {
      if (instr->m_opcode != LdSlotArr) {
        return;
      }
      bVar6 = IR::Opnd::IsScopeObjOpnd(instr->m_src1,instr->m_func);
      if (!bVar6) {
        return;
      }
      pJVar11 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
      bVar6 = JITTimeFunctionBody::HasImplicitArgIns(pJVar11);
      if (bVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x589,"(!instr->m_func->GetJITFunctionBody()->HasImplicitArgIns())",
                           "No mapping is required in this case. So it should already be generating ArgIns."
                          );
        if (!bVar6) goto LAB_004488a4;
        *puVar10 = 0;
      }
      pFVar3 = instr->m_func;
      pSVar12 = IR::Opnd::GetStackSym(pOVar2);
      Func::TrackFormalsArraySym(pFVar3,(pSVar12->super_Sym).m_id);
      return;
    }
    if (instr->m_func->parentFunc == (Func *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x58f,"(instr->m_func->IsInlined())","instr->m_func->IsInlined()");
      if (!bVar6) goto LAB_004488a4;
      *puVar10 = 0;
    }
    uVar1 = *(undefined4 *)&instr->m_func->actualCount;
    pJVar11 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
    AVar7 = JITTimeFunctionBody::GetInParamsCount(pJVar11);
    pFVar3 = instr->m_func;
    func = pFVar3->parentFunc;
    pSVar12 = IR::Opnd::GetStackSym(instr->m_src2);
    if ((pSVar12->field_0x18 & 1) == 0) {
      local_38 = (Instr *)0x0;
    }
    else {
      local_38 = (pSVar12->field_5).m_instrDef;
    }
    if ((instr->m_func->field_0x241 & 0x40) != 0) {
      pSVar12 = IR::Opnd::GetStackSym(local_38->m_src1);
      if (((pSVar12->field_0x18 & 1) != 0) && ((pSVar12->field_5).m_instrDef != (Instr *)0x0)) {
        pSVar12 = IR::Opnd::GetStackSym(local_38->m_src1);
        if ((pSVar12->field_0x18 & 1) == 0) {
          pIVar14 = (Instr *)0x0;
        }
        else {
          pIVar14 = (pSVar12->field_5).m_instrDef;
        }
        if (pIVar14->m_opcode != NewScObjectNoCtor) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x59e,
                             "(argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef() == nullptr || argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::NewScObjectNoCtor)"
                             ,
                             "argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef() == nullptr || argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::NewScObjectNoCtor"
                            );
          if (!bVar6) {
LAB_004488a4:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar10 = 0;
        }
      }
      pSVar12 = IR::Opnd::GetStackSym(local_38->m_src2);
      if ((pSVar12->field_0x18 & 1) == 0) {
        local_38 = (Instr *)0x0;
      }
      else {
        local_38 = (pSVar12->field_5).m_instrDef;
      }
    }
    sVar16 = (short)uVar1;
    uVar8 = sVar16 - 1;
    uVar15 = AVar7 - 1;
    if (uVar15 < uVar8) {
      for (sVar16 = sVar16 - AVar7; sVar16 != 0; sVar16 = sVar16 + -1) {
        pSVar12 = IR::Opnd::GetStackSym(local_38->m_src2);
        if ((pSVar12->field_0x18 & 1) == 0) {
          local_38 = (Instr *)0x0;
        }
        else {
          local_38 = (pSVar12->field_5).m_instrDef;
        }
      }
    }
    if (uVar15 != 0) {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      local_68 = (StackSym *)0x0;
      uVar17 = uVar15;
      do {
        if (local_38->m_src1 == (Opnd *)0x0) {
          pSVar12 = (StackSym *)0x0;
        }
        else {
          OVar5 = IR::Opnd::GetKind(local_38->m_src1);
          if (OVar5 == OpndKindReg) {
            pSVar12 = IR::Opnd::GetStackSym(local_38->m_src1);
          }
          else {
            pSVar12 = StackSym::New(func);
            pOVar2 = local_38->m_src1;
            pRVar13 = IR::RegOpnd::New(pSVar12,TyVar,func);
            pIVar14 = IR::Instr::New(Ld_A,&pRVar13->super_Opnd,pOVar2,func);
            IR::Instr::InsertBefore(instr,pIVar14);
          }
        }
        AVar7 = uVar17 - 1;
        bVar6 = Func::HasStackSymForFormal(pFVar3,AVar7);
        if (bVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x5c3,"(!func->HasStackSymForFormal(param - 1))",
                             "!func->HasStackSymForFormal(param - 1)");
          if (!bVar6) goto LAB_004488a4;
          *puVar10 = 0;
        }
        if (uVar8 < uVar17) {
          if (uVar15 <= uVar8) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x5cf,"(formalsCount > actualsCount)","formalsCount > actualsCount")
            ;
            if (!bVar6) goto LAB_004488a4;
            *puVar10 = 0;
          }
          if (local_68 == (StackSym *)0x0) {
            local_68 = StackSym::New(func);
            iVar9 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[1])();
            src1Opnd = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar9),AddrOpndKindDynamicMisc,func,
                                         false,(Var)0x0);
            pRVar13 = IR::RegOpnd::New(local_68,TyVar,func);
            pIVar14 = IR::Instr::New(Ld_A,&pRVar13->super_Opnd,&src1Opnd->super_Opnd,func);
            IR::Instr::InsertBefore(instr,pIVar14);
          }
          Func::TrackStackSymForFormalIndex(pFVar3,AVar7,local_68);
        }
        else {
          if (pSVar12 == (StackSym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x5c7,"(argOutSym)","argOutSym");
            if (!bVar6) goto LAB_004488a4;
            *puVar10 = 0;
          }
          Func::TrackStackSymForFormalIndex(pFVar3,AVar7,pSVar12);
          pSVar12 = IR::Opnd::GetStackSym(local_38->m_src2);
          if ((pSVar12->field_0x18 & 1) == 0) {
            local_38 = (Instr *)0x0;
          }
          else {
            local_38 = (pSVar12->field_5).m_instrDef;
          }
        }
        uVar17 = AVar7;
      } while (AVar7 != 0);
    }
  }
  return;
}

Assistant:

void
GlobOpt::TrackInstrsForScopeObjectRemoval(IR::Instr * instr)
{
    IR::Opnd* dst = instr->GetDst();
    IR::Opnd* src1 = instr->GetSrc1();

    if (instr->m_opcode == Js::OpCode::Ld_A && src1->IsRegOpnd())
    {
        AssertMsg(!instr->m_func->IsStackArgsEnabled() || !src1->IsScopeObjOpnd(instr->m_func), "There can be no aliasing for scope object.");
    }

    // The following is to track formals array for Stack Arguments optimization with Formals
    if (instr->m_func->IsStackArgsEnabled() && !this->IsLoopPrePass())
    {
        if (instr->m_opcode == Js::OpCode::LdSlotArr)
        {
            if (instr->GetSrc1()->IsScopeObjOpnd(instr->m_func))
            {
                AssertMsg(!instr->m_func->GetJITFunctionBody()->HasImplicitArgIns(), "No mapping is required in this case. So it should already be generating ArgIns.");
                instr->m_func->TrackFormalsArraySym(dst->GetStackSym()->m_id);
            }
        }
        else if (instr->m_opcode == Js::OpCode::InlineeStart)
        {
            Assert(instr->m_func->IsInlined());
            Js::ArgSlot actualsCount = instr->m_func->actualCount - 1;
            Js::ArgSlot formalsCount = instr->m_func->GetJITFunctionBody()->GetInParamsCount() - 1;

            Func * func = instr->m_func;
            Func * inlinerFunc = func->GetParentFunc(); //Inliner's func

            IR::Instr * argOutInstr = instr->GetSrc2()->GetStackSym()->GetInstrDef();

            //The argout immediately before the InlineeStart will be the ArgOut for NewScObject
            //So we don't want to track the stack sym for this argout.- Skipping it here.
            if (instr->m_func->IsInlinedConstructor())
            {
                //PRE might introduce a second defintion for the Src1. So assert for the opcode only when it has single definition.
                Assert(argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef() == nullptr ||
                    argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::NewScObjectNoCtor);
                argOutInstr = argOutInstr->GetSrc2()->GetStackSym()->GetInstrDef();
            }
            if (formalsCount < actualsCount)
            {
                Js::ArgSlot extraActuals = actualsCount - formalsCount;

                //Skipping extra actuals passed
                for (Js::ArgSlot i = 0; i < extraActuals; i++)
                {
                    argOutInstr = argOutInstr->GetSrc2()->GetStackSym()->GetInstrDef();
                }
            }

            StackSym * undefinedSym = nullptr;

            for (Js::ArgSlot param = formalsCount; param > 0; param--)
            {
                StackSym * argOutSym = nullptr;

                if (argOutInstr->GetSrc1())
                {
                    if (argOutInstr->GetSrc1()->IsRegOpnd())
                    {
                        argOutSym = argOutInstr->GetSrc1()->GetStackSym();
                    }
                    else
                    {
                        // We will always have ArgOut instr - so the source operand will not be removed.
                        argOutSym = StackSym::New(inlinerFunc);
                        IR::Opnd * srcOpnd = argOutInstr->GetSrc1();
                        IR::Opnd * dstOpnd = IR::RegOpnd::New(argOutSym, TyVar, inlinerFunc);
                        IR::Instr * assignInstr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, inlinerFunc);
                        instr->InsertBefore(assignInstr);
                    }
                }

                Assert(!func->HasStackSymForFormal(param - 1));

                if (param <= actualsCount)
                {
                    Assert(argOutSym);
                    func->TrackStackSymForFormalIndex(param - 1, argOutSym);
                    argOutInstr = argOutInstr->GetSrc2()->GetStackSym()->GetInstrDef();
                }
                else
                {
                    /*When param is out of range of actuals count, load undefined*/
                    // TODO: saravind: This will insert undefined for each of the param not having an actual. - Clean up this by having a sym for undefined on func ?
                    Assert(formalsCount > actualsCount);
                    if (undefinedSym == nullptr)
                    {
                        undefinedSym = StackSym::New(inlinerFunc);
                        IR::Opnd * srcOpnd = IR::AddrOpnd::New(inlinerFunc->GetScriptContextInfo()->GetUndefinedAddr(), IR::AddrOpndKindDynamicMisc, inlinerFunc);
                        IR::Opnd * dstOpnd = IR::RegOpnd::New(undefinedSym, TyVar, inlinerFunc);
                        IR::Instr * assignUndefined = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, inlinerFunc);
                        instr->InsertBefore(assignUndefined);
                    }
                    func->TrackStackSymForFormalIndex(param - 1, undefinedSym);
                }
            }
        }
    }
}